

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

UdpInputPortDeclSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::UdpInputPortDeclSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax>const&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *args_2)

{
  Token keyword;
  UdpInputPortDeclSyntax *pUVar1;
  size_t in_RCX;
  BumpAllocator *in_RDX;
  SeparatedSyntaxList<slang::syntax::IdentifierNameSyntax> *unaff_retaddr;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000008;
  UdpInputPortDeclSyntax *in_stack_00000010;
  size_t in_stack_ffffffffffffffd8;
  
  pUVar1 = (UdpInputPortDeclSyntax *)allocate(in_RDX,in_RCX,in_stack_ffffffffffffffd8);
  keyword.info = (Info *)args_1;
  keyword._0_8_ = args_2;
  slang::syntax::UdpInputPortDeclSyntax::UdpInputPortDeclSyntax
            (in_stack_00000010,in_stack_00000008,keyword,unaff_retaddr);
  return pUVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }